

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

void __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::ExplicitProducer::~ExplicitProducer(ExplicitProducer *this)

{
  FreeList<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
  *pFVar1;
  atomic<unsigned_int> *paVar2;
  __int_type_conflict2 _Var3;
  index_t iVar4;
  Block *pBVar5;
  ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits> *pCVar6;
  void *pvVar7;
  void *__ptr;
  long lVar8;
  Block *pBVar9;
  __pointer_type pBVar10;
  __pointer_type pBVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ExplicitProducer_0015eb28;
  pBVar9 = (this->super_ProducerBase).tailBlock;
  if (pBVar9 != (Block *)0x0) {
    if (((this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i & 0x1f) != 0)
    {
      uVar13 = this->pr_blockIndexFront - this->pr_blockIndexSlotsUsed;
      do {
        uVar13 = uVar13 & this->pr_blockIndexSize - 1;
        iVar4 = this->pr_blockIndexEntries[uVar13].base;
        uVar13 = uVar13 + 1;
      } while (0x8000000000000000 <
               (iVar4 - (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i
               ) + 0x20);
      if (iVar4 - (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i <
          0x8000000000000001) {
        __assert_fail("details::circular_less_than<index_t>(pr_blockIndexEntries[i].base, this->headIndex.load(std::memory_order_relaxed))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                      ,0x6b7,
                      "virtual moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::ExplicitProducer::~ExplicitProducer() [T = loop::MessageLoop::TaskInfo *, Traits = moodycamel::ConcurrentQueueDefaultTraits]"
                     );
      }
    }
    do {
      pBVar9 = pBVar9->next;
      if ((pBVar9->emptyFlags[0]._M_base._M_i & 1U) != 0) {
        lVar12 = 0;
        do {
          if (lVar12 == 0x1f) break;
          lVar8 = lVar12 + 1;
          lVar12 = lVar12 + 1;
        } while ((pBVar9->emptyFlags[lVar8]._M_base._M_i & 1U) != 0);
      }
    } while (pBVar9 != (this->super_ProducerBase).tailBlock);
  }
  pBVar9 = (this->super_ProducerBase).tailBlock;
  if (pBVar9 != (Block *)0x0) {
    do {
      pBVar5 = pBVar9->next;
      if (pBVar9->dynamicallyAllocated == true) {
        free(pBVar9);
      }
      else {
        pCVar6 = (this->super_ProducerBase).parent;
        LOCK();
        paVar2 = &pBVar9->freeListRefs;
        _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
        (paVar2->super___atomic_base<unsigned_int>)._M_i =
             (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
        UNLOCK();
        if (_Var3 == 0) {
          pBVar10 = (pCVar6->freeList).freeListHead._M_b._M_p;
          do {
            (pBVar9->freeListNext)._M_b._M_p = pBVar10;
            (pBVar9->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
            pFVar1 = &pCVar6->freeList;
            LOCK();
            pBVar11 = (pFVar1->freeListHead)._M_b._M_p;
            bVar14 = pBVar10 == pBVar11;
            if (bVar14) {
              (pFVar1->freeListHead)._M_b._M_p = pBVar9;
              pBVar11 = pBVar10;
            }
            UNLOCK();
            if (bVar14) break;
            LOCK();
            paVar2 = &pBVar9->freeListRefs;
            _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
            (paVar2->super___atomic_base<unsigned_int>)._M_i =
                 (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
            UNLOCK();
            pBVar10 = pBVar11;
          } while (_Var3 == 1);
        }
      }
      pBVar9 = pBVar5;
    } while (pBVar5 != (this->super_ProducerBase).tailBlock);
  }
  __ptr = this->pr_blockIndexRaw;
  while (__ptr != (void *)0x0) {
    pvVar7 = *(void **)((long)__ptr + 0x18);
    free(__ptr);
    __ptr = pvVar7;
  }
  return;
}

Assistant:

~ExplicitProducer()
		{
			// Destruct any elements not yet dequeued.
			// Since we're in the destructor, we can assume all elements
			// are either completely dequeued or completely not (no halfways).
			if (this->tailBlock != nullptr) {		// Note this means there must be a block index too
				// First find the block that's partially dequeued, if any
				Block* halfDequeuedBlock = nullptr;
				if ((this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) != 0) {
					// The head's not on a block boundary, meaning a block somewhere is partially dequeued
					// (or the head block is the tail block and was fully dequeued, but the head/tail are still not on a boundary)
					size_t i = (pr_blockIndexFront - pr_blockIndexSlotsUsed) & (pr_blockIndexSize - 1);
					while (details::circular_less_than<index_t>(pr_blockIndexEntries[i].base + BLOCK_SIZE, this->headIndex.load(std::memory_order_relaxed))) {
						i = (i + 1) & (pr_blockIndexSize - 1);
					}
					assert(details::circular_less_than<index_t>(pr_blockIndexEntries[i].base, this->headIndex.load(std::memory_order_relaxed)));
					halfDequeuedBlock = pr_blockIndexEntries[i].block;
				}
				
				// Start at the head block (note the first line in the loop gives us the head from the tail on the first iteration)
				auto block = this->tailBlock;
				do {
					block = block->next;
					if (block->ConcurrentQueue::Block::template is_empty<explicit_context>()) {
						continue;
					}
					
					size_t i = 0;	// Offset into block
					if (block == halfDequeuedBlock) {
						i = static_cast<size_t>(this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
					}
					
					// Walk through all the items in the block; if this is the tail block, we need to stop when we reach the tail index
					auto lastValidIndex = (this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 ? BLOCK_SIZE : static_cast<size_t>(this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
					while (i != BLOCK_SIZE && (block != this->tailBlock || i != lastValidIndex)) {
						(*block)[i++]->~T();
					}
				} while (block != this->tailBlock);
			}
			
			// Destroy all blocks that we own
			if (this->tailBlock != nullptr) {
				auto block = this->tailBlock;
				do {
					auto nextBlock = block->next;
					if (block->dynamicallyAllocated) {
						destroy(block);
					}
					else {
						this->parent->add_block_to_free_list(block);
					}
					block = nextBlock;
				} while (block != this->tailBlock);
			}
			
			// Destroy the block indices
			auto header = static_cast<BlockIndexHeader*>(pr_blockIndexRaw);
			while (header != nullptr) {
				auto prev = static_cast<BlockIndexHeader*>(header->prev);
				header->~BlockIndexHeader();
				(Traits::free)(header);
				header = prev;
			}
		}